

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

bool __thiscall
Catch::RunContext::sectionStarted(RunContext *this,SectionInfo *sectionInfo,Counts *assertions)

{
  pointer *pppIVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  iterator __position;
  IStreamingReporter *pIVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  size_t sVar7;
  int iVar8;
  SectionTracker *pSVar9;
  NameAndLocation local_60;
  
  paVar2 = &local_60.name.field_2;
  pcVar3 = (sectionInfo->name)._M_dataplus._M_p;
  local_60.name._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar3,pcVar3 + (sectionInfo->name)._M_string_length);
  local_60.location.file = (sectionInfo->lineInfo).file;
  local_60.location.line = (sectionInfo->lineInfo).line;
  pSVar9 = TestCaseTracking::SectionTracker::acquire(&this->m_trackerContext,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.name._M_dataplus._M_p != paVar2) {
    operator_delete(local_60.name._M_dataplus._M_p);
  }
  iVar8 = (*(pSVar9->super_TrackerBase).super_ITracker._vptr_ITracker[4])(pSVar9);
  if (SUB41(iVar8,0) != false) {
    __position._M_current =
         (this->m_activeSections).
         super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_60.name._M_dataplus._M_p = (pointer)pSVar9;
    if (__position._M_current ==
        (this->m_activeSections).
        super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>
      ::_M_realloc_insert<Catch::TestCaseTracking::ITracker*>
                ((vector<Catch::TestCaseTracking::ITracker*,std::allocator<Catch::TestCaseTracking::ITracker*>>
                  *)&this->m_activeSections,__position,(ITracker **)&local_60);
    }
    else {
      *__position._M_current = (ITracker *)pSVar9;
      pppIVar1 = &(this->m_activeSections).
                  super__Vector_base<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppIVar1 = *pppIVar1 + 1;
    }
    uVar5 = *(undefined4 *)((long)&(sectionInfo->lineInfo).file + 4);
    sVar7 = (sectionInfo->lineInfo).line;
    uVar6 = *(undefined4 *)((long)&(sectionInfo->lineInfo).line + 4);
    *(undefined4 *)&(this->m_lastAssertionInfo).lineInfo.file =
         *(undefined4 *)&(sectionInfo->lineInfo).file;
    *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.file + 4) = uVar5;
    *(int *)&(this->m_lastAssertionInfo).lineInfo.line = (int)sVar7;
    *(undefined4 *)((long)&(this->m_lastAssertionInfo).lineInfo.line + 4) = uVar6;
    pIVar4 = (this->m_reporter)._M_t.
             super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
             ._M_t.
             super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
    (*pIVar4->_vptr_IStreamingReporter[8])(pIVar4,sectionInfo);
    assertions->failedButOk = (this->m_totals).assertions.failedButOk;
    sVar7 = (this->m_totals).assertions.failed;
    assertions->passed = (this->m_totals).assertions.passed;
    assertions->failed = sVar7;
  }
  return SUB41(iVar8,0);
}

Assistant:

bool RunContext::sectionStarted(SectionInfo const & sectionInfo, Counts & assertions) {
        ITracker& sectionTracker = SectionTracker::acquire(m_trackerContext, TestCaseTracking::NameAndLocation(sectionInfo.name, sectionInfo.lineInfo));
        if (!sectionTracker.isOpen())
            return false;
        m_activeSections.push_back(&sectionTracker);

        m_lastAssertionInfo.lineInfo = sectionInfo.lineInfo;

        m_reporter->sectionStarting(sectionInfo);

        assertions = m_totals.assertions;

        return true;
    }